

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::RedirectedStreams::~RedirectedStreams(RedirectedStreams *this)

{
  long *local_38;
  long local_28 [2];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)this->m_redirectedCout,(ulong)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)this->m_redirectedCerr,(ulong)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  RedirectedStream::~RedirectedStream(&(this->m_redirectedStdErr).m_clog);
  RedirectedStream::~RedirectedStream(&(this->m_redirectedStdErr).m_cerr);
  ReusableStringStream::~ReusableStringStream(&(this->m_redirectedStdErr).m_rss);
  RedirectedStream::~RedirectedStream(&(this->m_redirectedStdOut).m_cout);
  ReusableStringStream::~ReusableStringStream(&(this->m_redirectedStdOut).m_rss);
  return;
}

Assistant:

RedirectedStreams::~RedirectedStreams() {
        m_redirectedCout += m_redirectedStdOut.str();
        m_redirectedCerr += m_redirectedStdErr.str();
    }